

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_addapply(CHAR_DATA *ch,char *argument)

{
  AFFECT_DATA *pAVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  OBJ_DATA *obj;
  OBJ_APPLY_DATA *pOVar5;
  short sVar6;
  AFFECT_DATA *af_00;
  AFFECT_DATA af;
  char arg2 [4608];
  char arg3 [4608];
  char arg1 [4608];
  
  pcVar4 = one_argument(argument,arg1);
  pcVar4 = one_argument(pcVar4,arg2);
  one_argument(pcVar4,arg3);
  if ((arg1[0] == '\0') || (arg2[0] == '\0')) {
    send_to_char("Syntax for applies: addapply <object> <apply type> <value>\n\r",ch);
    send_to_char("                    addapply <object> clear\n\r",ch);
    send_to_char("Apply Types: hp str dex int wis con mana\n\r",ch);
    send_to_char("             ac move hitroll damroll saves\n\r\n\r",ch);
    send_to_char("Syntax for affects: addapply <object> affect <affect name>\n\r",ch);
    send_to_char("Affect Names: blind invisible detect_evil detect_invis detect_magic\n\r",ch);
    send_to_char("              detect_hidden detect_good sanctuary infrared\n\r",ch);
    send_to_char("              curse poison protect_evil protect_good sneak hide sleep charm\n\r",
                 ch);
    send_to_char("              flying pass_door haste calm plague weaken dark_vision berserk\n\r",
                 ch);
    pcVar4 = "              waterbreath regeneration slow\n\r";
    goto LAB_002cef5b;
  }
  obj = get_obj_world(ch,arg1);
  if (obj == (OBJ_DATA *)0x0) {
    pcVar4 = "No such object exists!\n\r";
    goto LAB_002cef5b;
  }
  bVar2 = str_prefix(arg2,"clear");
  if (!bVar2) {
    af_00 = obj->charaffs;
    while (af_00 != (AFFECT_DATA *)0x0) {
      pAVar1 = af_00->next;
      free_affect(af_00);
      af_00 = pAVar1;
    }
    obj->charaffs = (AFFECT_DATA *)0x0;
    obj->apply = (OBJ_APPLY_DATA *)0x0;
    act("All affects removed from $p.",ch,obj,(void *)0x0,3);
    return;
  }
  if (arg3[0] == '\0') {
    return;
  }
  bVar2 = str_prefix(arg2,"hp");
  sVar6 = 0xd;
  if (bVar2) {
    bVar2 = str_prefix(arg2,"str");
    sVar6 = 1;
    if (!bVar2) goto LAB_002cef10;
    bVar2 = str_prefix(arg2,"dex");
    sVar6 = 2;
    if (!bVar2) goto LAB_002cef10;
    bVar2 = str_prefix(arg2,"int");
    sVar6 = 3;
    if (!bVar2) goto LAB_002cef10;
    bVar2 = str_prefix(arg2,"wis");
    sVar6 = 4;
    if (!bVar2) goto LAB_002cef10;
    bVar2 = str_prefix(arg2,"con");
    sVar6 = 5;
    if (!bVar2) goto LAB_002cef10;
    bVar2 = str_prefix(arg2,"mana");
    sVar6 = 0xc;
    if (!bVar2) goto LAB_002cef10;
    bVar2 = str_prefix(arg2,"move");
    sVar6 = 0xe;
    if (!bVar2) goto LAB_002cef10;
    bVar2 = str_prefix(arg2,"ac");
    sVar6 = 0x11;
    if (!bVar2) goto LAB_002cef10;
    bVar2 = str_prefix(arg2,"hitroll");
    sVar6 = 0x12;
    if (!bVar2) goto LAB_002cef10;
    bVar2 = str_prefix(arg2,"damroll");
    sVar6 = 0x13;
    if (!bVar2) goto LAB_002cef10;
    bVar2 = str_prefix(arg2,"saves");
    sVar6 = 0x19;
    if (!bVar2) goto LAB_002cef10;
    bVar2 = str_prefix(arg2,"affect");
    if (bVar2) {
      pcVar4 = "That apply is not possible!\n\r";
      goto LAB_002cef5b;
    }
    init_affect(&af);
    af.where = 0;
    iVar3 = skill_lookup(arg3);
    af.type = (short)iVar3;
    if (af.type == -1) {
      pcVar4 = "Invalid affect.\n\r";
      goto LAB_002cef5b;
    }
    af.level = obj->level;
    af.duration = -1;
    af.location = 0;
    af.modifier = 0;
    af.owner = (CHAR_DATA *)0x0;
    charaff_to_obj(obj,&af);
  }
  else {
LAB_002cef10:
    pOVar5 = new_apply_data();
    pOVar5->location = sVar6;
    bVar2 = is_number(arg3);
    if (!bVar2) {
      pcVar4 = "Applies require a numerical value.\n\r";
      goto LAB_002cef5b;
    }
    iVar3 = atoi(arg3);
    pOVar5->modifier = (short)iVar3;
    pOVar5->next = obj->apply;
    obj->apply = pOVar5;
  }
  pcVar4 = "Ok.\n\r";
LAB_002cef5b:
  send_to_char(pcVar4,ch);
  return;
}

Assistant:

void do_addapply(CHAR_DATA *ch, char *argument)
{
	OBJ_DATA *obj;
	AFFECT_DATA *paf, *paf_next, af;
	OBJ_APPLY_DATA *app, *app_next;
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	char arg3[MAX_INPUT_LENGTH];
	int modifier, location;

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);
	argument = one_argument(argument, arg3);

	if (arg1[0] == '\0' || arg2[0] == '\0')
	{
		send_to_char("Syntax for applies: addapply <object> <apply type> <value>\n\r", ch);
		send_to_char("                    addapply <object> clear\n\r", ch);
		send_to_char("Apply Types: hp str dex int wis con mana\n\r", ch);
		send_to_char("             ac move hitroll damroll saves\n\r\n\r", ch);
		send_to_char("Syntax for affects: addapply <object> affect <affect name>\n\r", ch);
		send_to_char("Affect Names: blind invisible detect_evil detect_invis detect_magic\n\r", ch);
		send_to_char("              detect_hidden detect_good sanctuary infrared\n\r", ch);
		send_to_char("              curse poison protect_evil protect_good sneak hide sleep charm\n\r", ch);
		send_to_char("              flying pass_door haste calm plague weaken dark_vision berserk\n\r", ch);
		send_to_char("              waterbreath regeneration slow\n\r", ch);
		return;
	}

	obj = get_obj_world(ch, arg1);
	if (obj == nullptr)
	{
		send_to_char("No such object exists!\n\r", ch);
		return;
	}

	if (!str_prefix(arg2, "clear"))
	{
		for (paf = obj->charaffs; paf; paf = paf_next)
		{
			paf_next = paf->next;
			free_affect(paf);
		}

		obj->charaffs = nullptr;

		for (app = obj->apply; app; app = app_next)
		{
			app_next = app->next;
		}

		obj->apply = nullptr;

		act("All affects removed from $p.", ch, obj, 0, TO_CHAR);
		return;
	}

	if (arg3[0] == '\0')
		return;

	if (!str_prefix(arg2, "hp"))
		location = APPLY_HIT;
	else if (!str_prefix(arg2, "str"))
		location = APPLY_STR;
	else if (!str_prefix(arg2, "dex"))
		location = APPLY_DEX;
	else if (!str_prefix(arg2, "int"))
		location = APPLY_INT;
	else if (!str_prefix(arg2, "wis"))
		location = APPLY_WIS;
	else if (!str_prefix(arg2, "con"))
		location = APPLY_CON;
	else if (!str_prefix(arg2, "mana"))
		location = APPLY_MANA;
	else if (!str_prefix(arg2, "move"))
		location = APPLY_MOVE;
	else if (!str_prefix(arg2, "ac"))
		location = APPLY_AC;
	else if (!str_prefix(arg2, "hitroll"))
		location = APPLY_HITROLL;
	else if (!str_prefix(arg2, "damroll"))
		location = APPLY_DAMROLL;
	else if (!str_prefix(arg2, "saves"))
		location = APPLY_SAVING_SPELL;
	else if (!str_prefix(arg2, "affect"))
		location = APPLY_SPELL_AFFECT;
	else
	{
		send_to_char("That apply is not possible!\n\r", ch);
		return;
	}

	if (location != APPLY_SPELL_AFFECT)
	{
		app = new_apply_data();
		app->location = location;

		if (is_number(arg3))
		{
			modifier = atoi(arg3);
		}
		else
		{
			send_to_char("Applies require a numerical value.\n\r", ch);
			return;
		}

		app->modifier = modifier;
		app->next = obj->apply;
		obj->apply = app;
	}
	else
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = skill_lookup(arg3);

		if (af.type == -1)
		{
			send_to_char("Invalid affect.\n\r", ch);
			return;
		}

		af.level = obj->level;
		af.duration = -1;
		af.location = 0;
		af.modifier = 0;
		af.owner = nullptr;
		charaff_to_obj(obj, &af);
	}

	send_to_char("Ok.\n\r", ch);
}